

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_client.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::DirectClient::DirectClient(DirectClient *this,string *host,int port)

{
  allocator<char> local_51;
  __shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  (this->super_Client)._vptr_Client = (_func_int **)&PTR__DirectClient_00209f98;
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  OutputStreamImpl::OutputStreamImpl(&this->output_stream_,this);
  InputStreamImpl::InputStreamImpl(&this->input_stream_,this);
  if (Log == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"DirectClient",&local_51)
    ;
    LoggerFactory::GetLogger((LoggerFactory *)&local_50,&local_40);
    std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)&Log,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::operator=((string *)&this->host_,(string *)host);
  this->port_ = port;
  return;
}

Assistant:

DirectClient::DirectClient(std::string host, int port) : output_stream_(OutputStreamImpl(*this)), input_stream_(InputStreamImpl(*this))
{
    if (Log == nullptr)
    {
        Log = LoggerFactory::GetLogger("DirectClient");
    }
    host_ = std::move(host);
    port_ = port;
}